

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

kStatus __thiscall
gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
          (Log *this,char *arguments,char *arguments_1,char *arguments_2,char *arguments_3)

{
  bool bVar1;
  int iVar2;
  char **in_R9;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char *arguments_local_3;
  char *arguments_local_2;
  char *arguments_local_1;
  char *arguments_local;
  Log *this_local;
  
  if (((this->isEnabled & 1U) != 0) &&
     (str.field_2._8_8_ = arguments_3, arguments_local_3 = arguments_2,
     arguments_local_2 = arguments_1, arguments_local_1 = arguments, arguments_local = (char *)this,
     bVar1 = WithinRange(this,kInfo), bVar1)) {
    ::fmt::v10::sprintf<char_const*,char_const*,char_const*,char_const*,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (v10 *)&arguments_local_1,&arguments_local_2,&arguments_local_3,
               (char **)((long)&str.field_2 + 8),in_R9);
    iVar2 = SendLogMessage(this,kInfo,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58);
    this_local._4_4_ = kSendError;
    if (0 < iVar2) {
      this_local._4_4_ = kOk;
    }
    std::__cxx11::string::~string((string *)local_58);
    return this_local._4_4_;
  }
  return kFiltered;
}

Assistant:

inline kStatus Info(T... arguments) const {
            if (!(isEnabled && WithinRange(kInfo))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kInfo, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }